

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void restore_tiles(tgestate_t *state)

{
  vischar_t *vischar;
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  tile_t *ptVar6;
  char cVar7;
  long lVar8;
  tilerow_t *ptVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  byte *pbVar13;
  tilerow_t *ptVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t clipped_height;
  uint8_t top_skip;
  uint8_t clipped_width;
  uint8_t left_skip;
  byte local_50;
  uint8_t local_4f;
  uint8_t local_4e;
  uint8_t local_4d;
  uint local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  state->IY = state->vischars;
  cVar4 = '\b';
  do {
    vischar = state->IY;
    if (vischar->flags != 0xff) {
      uVar15 = (uint8_t)((vischar->isopos).y >> 3);
      (state->isopos).y = uVar15;
      uVar16 = (uint8_t)((vischar->isopos).x >> 3);
      (state->isopos).x = uVar16;
      iVar5 = vischar_visible(state,vischar,&local_4d,&local_4e,&local_4f,&local_50);
      uVar1 = local_4e;
      if (iVar5 == 0) {
        bVar2 = (local_50 >> 3) + 2;
        bVar10 = uVar15 - (state->map_position).y;
        cVar7 = bVar10 + bVar2;
        if (((cVar7 < '\0') || (cVar7 = cVar7 - (char)state->rows, cVar7 < '\x01')) ||
           (bVar2 = bVar2 - cVar7, '\0' < (char)bVar2)) {
          uVar11 = (uint)bVar2;
          if (4 < bVar2) {
            uVar11 = 5;
          }
          if (local_4d == '\0') {
            bVar2 = uVar16 - (state->map_position).x;
          }
          else {
            bVar2 = 0;
          }
          cVar7 = (char)state->columns;
          bVar3 = cVar7 - local_4e;
          local_40 = (ulong)(byte)(cVar7 * '\a' + bVar3);
          uVar12 = (ulong)bVar10;
          if (local_4f != '\0') {
            uVar12 = 0;
          }
          ptVar14 = state->window_buf + (ulong)bVar2 + state->window_buf_stride * uVar12;
          pbVar13 = state->tile_buf + (int)(state->columns * (int)uVar12 + (uint)bVar2);
          local_38 = (ulong)bVar3;
          do {
            local_48 = uVar11;
            local_4c = (uint)uVar12;
            local_44 = local_4c & 0xff;
            uVar15 = uVar1;
            do {
              bVar10 = *pbVar13;
              ptVar6 = select_tile_set(state,bVar2,(uint8_t)local_44);
              lVar8 = 0;
              ptVar9 = ptVar14;
              do {
                *ptVar9 = ptVar6[bVar10].row[lVar8];
                ptVar9 = ptVar9 + state->columns;
                lVar8 = lVar8 + 1;
              } while ((char)lVar8 != '\b');
              bVar2 = bVar2 + 1;
              pbVar13 = pbVar13 + 1;
              ptVar14 = ptVar14 + 1;
              uVar15 = uVar15 + 0xff;
            } while (uVar15 != '\0');
            bVar2 = bVar2 - uVar1;
            uVar12 = (ulong)CONCAT31((int3)(local_4c >> 8),(char)local_4c + '\x01');
            pbVar13 = pbVar13 + local_38;
            ptVar14 = ptVar14 + local_40;
            cVar7 = (char)local_48 + -1;
            uVar11 = CONCAT31((int3)(local_48 >> 8),cVar7);
          } while (cVar7 != '\0');
        }
      }
    }
    state->IY = state->IY + 1;
    cVar4 = cVar4 + -1;
  } while (cVar4 != '\0');
  return;
}

Assistant:

void restore_tiles(tgestate_t *state)
{
  uint8_t            iters;                         /* was B */
  const vischar_t   *vischar;                       /* new local copy */
  uint8_t            height;                        /* was A/$BC5F */
  int8_t             bottom;                        /* was A */
  uint8_t            width;                         /* was $BC61 */
  uint8_t            tilebuf_skip;                  /* was $BC8E */
  uint8_t            windowbuf_skip;                /* was $BC95 */
  uint8_t            width_counter, height_counter; /* was B,C */
  uint8_t            left_skip;                     /* was B */
  uint8_t            clipped_width;                 /* was C */
  uint8_t            top_skip;                      /* was D */
  uint8_t            clipped_height;                /* was E */
  const pos8_t      *map_position;                  /* was HL */
  uint8_t           *windowbuf;                     /* was HL */
  uint8_t           *windowbuf2;                    /* was DE */
  uint8_t            x, y;                          /* was H', L' */
  const tileindex_t *tilebuf;                       /* was HL/DE */
  tileindex_t        tile;                          /* was A */
  const tile_t      *tileset;                       /* was BC */
  uint8_t            tile_counter;                  /* was B' */
  const tilerow_t   *tilerow;                       /* was HL' */

  assert(state != NULL);

  iters     = vischars_LENGTH;
  state->IY = &state->vischars[0];
  do
  {
    vischar = state->IY; /* Conv: Added local copy of IY. */

    if (vischar->flags == vischar_FLAGS_EMPTY_SLOT)
      goto next;

    /* Get the visible character's position in screen space. */
    state->isopos.y = vischar->isopos.y >> 3; /* divide by 8 (16-to-8) */
    state->isopos.x = vischar->isopos.x >> 3; /* divide by 8 (16-to-8) */

    if (vischar_visible(state,
                        vischar,
                       &left_skip,
                       &clipped_width,
                       &top_skip,
                       &clipped_height))
      goto next; /* not visible */

    /* Compute scaled clipped height. */
    /* Conv: Rotate and mask turned into right shift. */
    height = (clipped_height >> 3) + 2; /* TODO: Explain the +2 fudge factor. */

    /* Note: It seems that the following sequence (from here to clamp_height)
     * duplicates the work done by vischar_visible. I can't see any benefit to
     * it. */

    /* Compute bottom = height + isopos_y - map_position_y. This is the
     * distance of the (clipped) bottom edge of the vischar from the top of the
     * window. */
    bottom = height + state->isopos.y - state->map_position.y;
    if (bottom >= 0)
    {
      /* Bottom edge is on-screen, or off the bottom of the screen. */

      bottom -= state->rows; /* i.e. 17 */
      if (bottom > 0)
      {
        /* Bottom edge is now definitely visible. */

        int8_t visible_height; /* was A */

        visible_height = height - bottom;
        if (visible_height < 0)
        {
          goto next; /* not visible */
        }
        else if (visible_height != 0)
        {
          height = visible_height;
          goto clamp_height;
        }
        else
        {
          /* Note: Could merge this case into the earlier one. */
          assert(visible_height == 0);
          goto next; /* not visible */
        }
      }
    }

clamp_height:
    /* Clamp the height to a maximum of five. */
    if (height > 5)
      height = 5;

    /* Conv: Self modifying code replaced. */

    width          = clipped_width;
    tilebuf_skip   = state->columns - width;
    windowbuf_skip = tilebuf_skip + 7 * state->columns;

    map_position   = &state->map_position;

    /* Work out x,y offsets into the tile buffer. */

    if (left_skip == 0)
      x = state->isopos.x - map_position->x;
    else
      x = 0; /* was interleaved */

    if (top_skip == 0)
      y = state->isopos.y - map_position->y;
    else
      y = 0; /* was interleaved */

    /* Calculate the offset into the window buffer. */

    windowbuf = &state->window_buf[y * state->window_buf_stride + x];
    ASSERT_WINDOW_BUF_PTR_VALID(windowbuf, 0);

    /* Calculate the offset into the tile buffer. */

    tilebuf = &state->tile_buf[x + y * state->columns];
    ASSERT_TILE_BUF_PTR_VALID(tilebuf);

    height_counter = height; /* in rows */
    do
    {
      width_counter = width; /* in columns */
      do
      {
        ASSERT_TILE_BUF_PTR_VALID(tilebuf);

        tile = *tilebuf;
        windowbuf2 = windowbuf;

        tileset = select_tile_set(state, x, y);

        ASSERT_WINDOW_BUF_PTR_VALID(windowbuf2, 0);
        ASSERT_WINDOW_BUF_PTR_VALID(windowbuf2 + 7 * state->columns, 0);

        /* Copy the tile into the window buffer. */
        tilerow = &tileset[tile].row[0];
        tile_counter = 8;
        do
        {
          *windowbuf2 = *tilerow++;
          windowbuf2 += state->columns;
        }
        while (--tile_counter);

        /* Move to next column. */
        x++;
        tilebuf++;
        if (width_counter > 1)
          ASSERT_TILE_BUF_PTR_VALID(tilebuf);
        windowbuf++;
        if (width_counter > 1)
          ASSERT_WINDOW_BUF_PTR_VALID(windowbuf, 0);
      }
      while (--width_counter);

      /* Reset x offset. Advance to next row. */
      x -= width;
      y++;
      tilebuf   += tilebuf_skip;
      if (height_counter > 1)
        ASSERT_TILE_BUF_PTR_VALID(tilebuf);
      windowbuf += windowbuf_skip;
      if (height_counter > 1)
        ASSERT_WINDOW_BUF_PTR_VALID(windowbuf, 0);
    }
    while (--height_counter);

next:
    state->IY++;
  }
  while (--iters);
}